

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LogicalXorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalxor(NeuralNetworkLayer *this)

{
  bool bVar1;
  LogicalXorLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_logicalxor(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_logicalxor(this);
    this_00 = (LogicalXorLayerParams *)operator_new(0x18);
    LogicalXorLayerParams::LogicalXorLayerParams(this_00);
    (this->layer_).logicalxor_ = this_00;
  }
  return (LogicalXorLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalXorLayerParams* NeuralNetworkLayer::mutable_logicalxor() {
  if (!has_logicalxor()) {
    clear_layer();
    set_has_logicalxor();
    layer_.logicalxor_ = new ::CoreML::Specification::LogicalXorLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalXor)
  return layer_.logicalxor_;
}